

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLog::WriteSequenceValue(WriteAheadLog *this,SequenceValue val)

{
  BinarySerializer *this_00;
  SequenceCatalogEntry *pSVar1;
  WriteAheadLogSerializer serializer;
  
  pSVar1 = val.entry;
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,SEQUENCE_VALUE);
  this_00 = &serializer.serializer;
  Serializer::WriteProperty<std::__cxx11::string>
            (&this_00->super_Serializer,0x65,"schema",
             &(((pSVar1->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.name
            );
  Serializer::WriteProperty<std::__cxx11::string>
            (&this_00->super_Serializer,0x66,"name",
             &(pSVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  Serializer::WriteProperty<unsigned_long>
            (&this_00->super_Serializer,0x67,"usage_count",&val.usage_count);
  Serializer::WriteProperty<long>(&this_00->super_Serializer,0x68,"counter",&val.counter);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteSequenceValue(SequenceValue val) {
	auto &sequence = *val.entry;
	WriteAheadLogSerializer serializer(*this, WALType::SEQUENCE_VALUE);
	serializer.WriteProperty(101, "schema", sequence.schema.name);
	serializer.WriteProperty(102, "name", sequence.name);
	serializer.WriteProperty(103, "usage_count", val.usage_count);
	serializer.WriteProperty(104, "counter", val.counter);
	serializer.End();
}